

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV1
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  complex<float> *array_00;
  uchar *array_01;
  double *array_02;
  int *array_03;
  long *array_04;
  unsigned_long *array_05;
  short *array_06;
  unsigned_short *array_07;
  uint *array_08;
  longdouble *array_09;
  float *array_10;
  IO *pIVar1;
  undefined8 uVar2;
  int iVar3;
  DataType DVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  BP5Deserializer *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ostream *poVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  DataType type;
  DataType type_00;
  char *pcVar13;
  BP5Deserializer *this_00;
  _Alloc_hider _Var14;
  complex<double> *pcVar15;
  pointer pcVar16;
  size_type sVar17;
  bool bVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  DataType Type;
  int ElemSize;
  string local_478;
  string local_458;
  BP5Deserializer *local_438;
  size_type local_430;
  undefined1 local_428 [42];
  allocator local_3fe;
  allocator local_3fd;
  DataType local_3fc;
  ulong local_3f8;
  void *local_3f0;
  char *local_3e8;
  long local_3e0;
  int local_3d4;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  string local_50;
  
  local_438 = this;
  if (this->m_LastAttrStep != Step) {
    core::IO::RemoveAllAttributes(this->m_Engine->m_IO);
    this->m_LastAttrStep = Step;
  }
  uVar5 = FMFormat_of_original(FFSformat);
  lVar6 = format_list_of_FMFormat(uVar5);
  local_3e0 = *(long *)(lVar6 + 8);
  local_3f8 = 0;
  do {
    lVar6 = local_3e0;
    lVar7 = (long)(int)local_3f8;
    pcVar9 = *(char **)(local_3e0 + lVar7 * 0x18);
    if (pcVar9 == (char *)0x0) {
      return;
    }
    pcVar15 = (complex<double> *)((long)*(int *)(lVar7 * 0x18 + local_3e0 + 0x14) + (long)BaseData);
    sVar8 = strlen(pcVar9);
    pcVar13 = "ElemCount";
    iVar3 = strcmp("ElemCount",pcVar9 + (sVar8 - 9));
    if (iVar3 == 0) {
      local_430 = *(size_type *)pcVar15->_M_value;
      pcVar9 = strdup((char *)(*(long *)(lVar6 + 0x18 + lVar7 * 0x18) + 4));
      __s = (BP5Deserializer *)strdup(*(char **)(lVar6 + 0x20 + lVar7 * 0x18));
      this_00 = __s;
      pcVar13 = strchr((char *)__s,0x5b);
      *pcVar13 = '\0';
      DVar4 = TranslateFFSType2ADIOS(this_00,(char *)__s,*(int *)(lVar6 + 0x28 + lVar7 * 0x18));
      sVar17 = local_430;
      switch(DVar4) {
      case Int8:
        pcVar13 = *(char **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
        core::IO::DefineAttribute<signed_char>
                  (pIVar1,&local_458,pcVar13,local_430,&local_478,&local_250,true);
        paVar10 = &local_250.field_2;
        _Var14._M_p = local_250._M_dataplus._M_p;
        break;
      case Int16:
        array_06 = *(short **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
        core::IO::DefineAttribute<short>
                  (pIVar1,&local_458,array_06,local_430,&local_478,&local_270,true);
        paVar10 = &local_270.field_2;
        _Var14._M_p = local_270._M_dataplus._M_p;
        break;
      case Int32:
        array_03 = *(int **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
        core::IO::DefineAttribute<int>
                  (pIVar1,&local_458,array_03,local_430,&local_478,&local_290,true);
        paVar10 = &local_290.field_2;
        _Var14._M_p = local_290._M_dataplus._M_p;
        break;
      case Int64:
        array_04 = *(long **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
        core::IO::DefineAttribute<long>
                  (pIVar1,&local_458,array_04,local_430,&local_478,&local_2b0,true);
        paVar10 = &local_2b0.field_2;
        _Var14._M_p = local_2b0._M_dataplus._M_p;
        break;
      case UInt8:
        array_01 = *(uchar **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
        core::IO::DefineAttribute<unsigned_char>
                  (pIVar1,&local_458,array_01,local_430,&local_478,&local_2d0,true);
        paVar10 = &local_2d0.field_2;
        _Var14._M_p = local_2d0._M_dataplus._M_p;
        break;
      case UInt16:
        array_07 = *(unsigned_short **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
        core::IO::DefineAttribute<unsigned_short>
                  (pIVar1,&local_458,array_07,local_430,&local_478,&local_2f0,true);
        paVar10 = &local_2f0.field_2;
        _Var14._M_p = local_2f0._M_dataplus._M_p;
        break;
      case UInt32:
        array_08 = *(uint **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/","");
        core::IO::DefineAttribute<unsigned_int>
                  (pIVar1,&local_458,array_08,local_430,&local_478,&local_310,true);
        paVar10 = &local_310.field_2;
        _Var14._M_p = local_310._M_dataplus._M_p;
        break;
      case UInt64:
        array_05 = *(unsigned_long **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"/","");
        core::IO::DefineAttribute<unsigned_long>
                  (pIVar1,&local_458,array_05,local_430,&local_478,&local_330,true);
        paVar10 = &local_330.field_2;
        _Var14._M_p = local_330._M_dataplus._M_p;
        break;
      case Float:
        array_10 = *(float **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"/","");
        core::IO::DefineAttribute<float>
                  (pIVar1,&local_458,array_10,local_430,&local_478,&local_350,true);
        paVar10 = &local_350.field_2;
        _Var14._M_p = local_350._M_dataplus._M_p;
        break;
      case Double:
        array_02 = *(double **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"/","");
        core::IO::DefineAttribute<double>
                  (pIVar1,&local_458,array_02,local_430,&local_478,&local_370,true);
        paVar10 = &local_370.field_2;
        _Var14._M_p = local_370._M_dataplus._M_p;
        break;
      case LongDouble:
        array_09 = *(longdouble **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"/","");
        core::IO::DefineAttribute<long_double>
                  (pIVar1,&local_458,array_09,local_430,&local_478,&local_390,true);
        paVar10 = &local_390.field_2;
        _Var14._M_p = local_390._M_dataplus._M_p;
        break;
      case FloatComplex:
        array_00 = *(complex<float> **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"/","");
        core::IO::DefineAttribute<std::complex<float>>
                  (pIVar1,&local_458,array_00,local_430,&local_478,&local_3b0,true);
        paVar10 = &local_3b0.field_2;
        _Var14._M_p = local_3b0._M_dataplus._M_p;
        break;
      case DoubleComplex:
        pcVar15 = *(complex<double> **)(pcVar15->_M_value + 8);
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"/","");
        core::IO::DefineAttribute<std::complex<double>>
                  (pIVar1,&local_458,pcVar15,local_430,&local_478,&local_3d0,true);
        paVar10 = &local_3d0.field_2;
        _Var14._M_p = local_3d0._M_dataplus._M_p;
        break;
      case String:
        local_428._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_428._8_8_ = (pointer)0x0;
        local_428._16_8_ = (pointer)0x0;
        local_3f0 = BaseData;
        local_3e8 = pcVar9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_428,local_430);
        if (sVar17 != 0) {
          lVar6 = *(long *)(pcVar15->_M_value + 8);
          lVar7 = 0;
          sVar17 = 0;
          do {
            pcVar9 = *(char **)(lVar6 + sVar17 * 8);
            pcVar13 = *(char **)(local_428._0_8_ + lVar7 + 8);
            pcVar16 = (pointer)(local_428._0_8_ + lVar7);
            strlen(pcVar9);
            std::__cxx11::string::_M_replace((ulong)pcVar16,0,pcVar13,(ulong)pcVar9);
            sVar17 = sVar17 + 1;
            lVar7 = lVar7 + 0x20;
          } while (local_430 != sVar17);
        }
        pcVar9 = local_3e8;
        pIVar1 = local_438->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_458,local_3e8,(allocator *)&local_3fc);
        uVar2 = local_428._8_8_;
        uVar5 = local_428._0_8_;
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
        core::IO::DefineAttribute<std::__cxx11::string>
                  (pIVar1,&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                   (long)(uVar2 - uVar5) >> 5,&local_478,&local_50,true);
        BaseData = local_3f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_428);
        goto LAB_0061ca6e;
      default:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
        ToString_abi_cxx11_(&local_458,(adios2 *)(ulong)DVar4,type);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_458._M_dataplus._M_p,
                             local_458._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_0061ca5a;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != paVar10) {
        operator_delete(_Var14._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
LAB_0061ca5a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
LAB_0061ca6e:
      free(pcVar9);
      local_3f8 = (ulong)((int)local_3f8 + 2);
      bVar18 = true;
    }
    else {
      pcVar9 = BreakdownVarName((BP5Deserializer *)pcVar13,pcVar9,&local_3fc,&local_3d4);
      DVar4 = local_3fc;
      bVar18 = local_3fc != Struct;
      if (bVar18) {
        switch(local_3fc) {
        case Int8:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_c0._16_8_ = local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"/","");
          core::IO::DefineAttribute<signed_char>
                    (pIVar1,&local_458,(char *)pcVar15,&local_478,(string *)(local_c0 + 0x10),true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
          uVar5 = local_c0._16_8_;
          break;
        case Int16:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_e0._16_8_ = local_c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_e0 + 0x10),"/","");
          core::IO::DefineAttribute<short>
                    (pIVar1,&local_458,(short *)pcVar15,&local_478,(string *)(local_e0 + 0x10),true)
          ;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
          uVar5 = local_e0._16_8_;
          break;
        case Int32:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_100._16_8_ = local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_100 + 0x10),"/","");
          core::IO::DefineAttribute<int>
                    (pIVar1,&local_458,(int *)pcVar15,&local_478,(string *)(local_100 + 0x10),true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
          uVar5 = local_100._16_8_;
          break;
        case Int64:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_120._16_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 0x10),"/","");
          core::IO::DefineAttribute<long>
                    (pIVar1,&local_458,(long *)pcVar15,&local_478,(string *)(local_120 + 0x10),true)
          ;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
          uVar5 = local_120._16_8_;
          break;
        case UInt8:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_140._16_8_ = local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_140 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar1,&local_458,(uchar *)pcVar15,&local_478,(string *)(local_140 + 0x10),true
                    );
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
          uVar5 = local_140._16_8_;
          break;
        case UInt16:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_160._16_8_ = local_140;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar1,&local_458,(unsigned_short *)pcVar15,&local_478,
                     (string *)(local_160 + 0x10),true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
          uVar5 = local_160._16_8_;
          break;
        case UInt32:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_180._16_8_ = local_160;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_180 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_int>
                    (pIVar1,&local_458,(uint *)pcVar15,&local_478,(string *)(local_180 + 0x10),true)
          ;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
          uVar5 = local_180._16_8_;
          break;
        case UInt64:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_1a0._16_8_ = local_180;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a0 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar1,&local_458,(unsigned_long *)pcVar15,&local_478,
                     (string *)(local_1a0 + 0x10),true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
          uVar5 = local_1a0._16_8_;
          break;
        case Float:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_1c0._16_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1c0 + 0x10),"/","");
          core::IO::DefineAttribute<float>
                    (pIVar1,&local_458,(float *)pcVar15,&local_478,(string *)(local_1c0 + 0x10),true
                    );
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
          uVar5 = local_1c0._16_8_;
          break;
        case Double:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_1e0._16_8_ = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1e0 + 0x10),"/","");
          core::IO::DefineAttribute<double>
                    (pIVar1,&local_458,(double *)pcVar15,&local_478,(string *)(local_1e0 + 0x10),
                     true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
          uVar5 = local_1e0._16_8_;
          break;
        case LongDouble:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_200._16_8_ = local_1e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_200 + 0x10),"/","");
          core::IO::DefineAttribute<long_double>
                    (pIVar1,&local_458,(longdouble *)pcVar15,&local_478,(string *)(local_200 + 0x10)
                     ,true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
          uVar5 = local_200._16_8_;
          break;
        case FloatComplex:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_210._M_allocated_capacity = (size_type)local_200;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar1,&local_458,(complex<float> *)pcVar15,&local_478,(string *)&local_210,
                     true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
          uVar5 = local_210._M_allocated_capacity;
          break;
        case DoubleComplex:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_230._0_8_ = local_230 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"/","");
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar1,&local_458,pcVar15,&local_478,(string *)local_230,true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_230 + 0x10);
          uVar5 = local_230._0_8_;
          break;
        case String:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,&local_3fd);
          std::__cxx11::string::string((string *)&local_478,*(char **)pcVar15->_M_value,&local_3fe);
          local_428._0_8_ = local_428 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
          local_80._16_8_ = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"/","");
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar1,&local_458,&local_478,(string *)local_428,(string *)(local_80 + 0x10),
                     true);
          if ((undefined1 *)local_80._16_8_ != local_60) {
            operator_delete((void *)local_80._16_8_);
          }
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_428 + 0x10);
          uVar5 = local_428._0_8_;
          break;
        case Char:
          pIVar1 = local_438->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_458,pcVar9,(allocator *)local_428);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
          local_a0._16_8_ = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"/","");
          core::IO::DefineAttribute<char>
                    (pIVar1,&local_458,(char *)pcVar15,&local_478,(string *)(local_a0 + 0x10),true);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
          uVar5 = local_a0._16_8_;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
          ToString_abi_cxx11_(&local_458,(adios2 *)(ulong)DVar4,type_00);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_458._M_dataplus._M_p,
                               local_458._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar11);
          goto LAB_0061d3ff;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5 != pbVar12) {
          operator_delete((void *)uVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
LAB_0061d3ff:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
        local_3f8 = (ulong)((int)local_3f8 + 1);
      }
    }
    if (!bVar18) {
      return;
    }
  } while( true );
}

Assistant:

void BP5Deserializer::InstallAttributesV1(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    FMFieldList FieldList;
    FMStructDescList FormatList;

    if (Step != m_LastAttrStep)
    {
        m_Engine->m_IO.RemoveAllAttributes();
        m_LastAttrStep = Step;
    }
    FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
    FieldList = FormatList[0].field_list;
    int i = 0;
    while (FieldList[i].field_name)
    {
        void *field_data = (char *)BaseData + FieldList[i].field_offset;

        if (!NameIndicatesAttrArray(FieldList[i].field_name))
        {
            DataType Type;
            int ElemSize;
            const char *FieldName = BreakdownVarName(FieldList[i].field_name, &Type, &ElemSize);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, *(char **)field_data, "",
                                                            "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, *(T *)field_data, "", "/", true);             \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
            i++;
        }
        else
        {
            DataType Type;
            size_t ElemCount = *(size_t *)field_data;
            field_data = (void *)((char *)field_data + sizeof(size_t));
            i++;
            char *FieldName = strdup(FieldList[i].field_name + 4); // skip BP5_
            char *FieldType = strdup(FieldList[i].field_type);
            *strchr(FieldType, '[') = 0;
            Type = (DataType)TranslateFFSType2ADIOS(FieldType, FieldList[i].field_size);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                std::vector<std::string> array;
                array.resize(ElemCount);
                char **str_array = *(char ***)field_data;
                for (size_t i = 0; i < ElemCount; i++)
                {
                    array[i].assign(str_array[i]);
                }
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, array.data(), array.size(),
                                                            "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        T **array = *(T ***)field_data;                                                            \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, (T *)array, ElemCount, "", "/", true);        \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }